

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.h
# Opt level: O3

ArrayIDIDFunc *
inverse_permutation<ArrayIDIDFunc>(ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *f)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (f->super_ArrayIDFunc<int>).preimage_count_;
  uVar5 = (ulong)uVar1;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = uVar1;
  if (uVar5 == 0) {
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = (int *)0x0;
    __return_storage_ptr__->image_count_ = uVar1;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = uVar5 * 4;
    }
    piVar3 = (int *)operator_new__(uVar4);
    (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar3;
    __return_storage_ptr__->image_count_ = uVar1;
    if (0 < (int)uVar1) {
      piVar2 = (f->super_ArrayIDFunc<int>).data_;
      uVar4 = 0;
      do {
        piVar3[piVar2[uVar4]] = (int)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc inverse_permutation(const IDIDFunc& f)
{
    assert(is_permutation(f));

    int id_count = f.preimage_count();

    ArrayIDIDFunc inv_f(id_count, id_count);
    for (int i = 0; i < id_count; ++i)
        inv_f[f(i)] = i;
    return inv_f; // NVRO
}